

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerTestObject.h
# Opt level: O2

RecyclerTestObject * ScannedObject<51U,_1000U>::New(void)

{
  uint uVar1;
  Recycler *alloc;
  ScannedObject<51U,_1000U> *this;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  uVar1 = PAL_rand();
  data.typeinfo = (type_info *)(ulong)((uVar1 % 0x3b6) * 8 + 0x198);
  local_40 = (undefined1  [8])&ScannedObject<51u,1000u>::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_424f;
  data.filename._0_4_ = 0xb1;
  alloc = Memory::Recycler::TrackAllocInfo(recyclerInstance,(TrackAllocData *)local_40);
  this = (ScannedObject<51U,_1000U> *)new<Memory::Recycler>(0x18,alloc,0x1e6d90,0);
  ScannedObject(this,uVar1 % 0x3b6 + 0x33);
  return &this->super_RecyclerTestObject;
}

Assistant:

static RecyclerTestObject * New()
    {
        unsigned int count = minCount + GetRandomInteger(maxCount - minCount + 1);

        return RecyclerNewPlus(recyclerInstance, sizeof(RecyclerTestObject *) * count, ScannedObject, count);
    }